

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectAnds(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vNodes,Vec_Int_t *vLeaves)

{
  int Id;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar4 = 0;
  Gia_ObjSetTravIdCurrentId(p,0);
  if (vLeaves != (Vec_Int_t *)0x0) {
    for (; iVar4 < vLeaves->nSize; iVar4 = iVar4 + 1) {
      Id = Vec_IntEntry(vLeaves,iVar4);
      Gia_ObjSetTravIdCurrentId(p,Id);
    }
  }
  vNodes->nSize = 0;
  uVar5 = 0;
  uVar6 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar6 = uVar5;
  }
  do {
    if (uVar6 == uVar5) {
      return;
    }
    pGVar2 = Gia_ManObj(p,pNodes[uVar5]);
    uVar1 = (uint)*(ulong *)pGVar2;
    uVar3 = *(ulong *)pGVar2 & 0x1fffffff;
    if (uVar3 == 0x1fffffff || -1 < (int)uVar1) {
      if (-1 < (int)uVar1 && (int)uVar3 != 0x1fffffff) {
        iVar4 = pNodes[uVar5];
        goto LAB_005c558e;
      }
    }
    else {
      iVar4 = pNodes[uVar5] - (uVar1 & 0x1fffffff);
LAB_005c558e:
      Gia_ManCollectAnds_rec(p,iVar4,vNodes);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void Gia_ManCollectAnds( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vNodes, Vec_Int_t * vLeaves )
{
    int i, iLeaf; 
//    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    if ( vLeaves )
        Vec_IntForEachEntry( vLeaves, iLeaf, i )
            Gia_ObjSetTravIdCurrentId( p, iLeaf );
    Vec_IntClear( vNodes );
    for ( i = 0; i < nNodes; i++ )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectAnds_rec( p, Gia_ObjFaninId0(pObj, pNodes[i]), vNodes );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManCollectAnds_rec( p, pNodes[i], vNodes );
    }
}